

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O0

void dump_args(mmt_memory_dump *args,int argc,uint64_t except_ptr)

{
  mmt_buf *pmVar1;
  mmt_memory_dump *pmVar2;
  mmt_buf *data;
  mmt_memory_dump *arg;
  int j;
  int i;
  uint64_t except_ptr_local;
  int argc_local;
  mmt_memory_dump *args_local;
  
  for (arg._4_4_ = 0; arg._4_4_ < argc; arg._4_4_ = arg._4_4_ + 1) {
    pmVar2 = args + arg._4_4_;
    pmVar1 = pmVar2->data;
    if (pmVar2->addr != except_ptr) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         addr: 0x%016llx, size: %d, data:",pmVar2->addr,
                (ulong)pmVar1->len);
      }
      else {
        fprintf(_stdout,"%64s        addr: 0x%016llx, size: %d, data:"," ",pmVar2->addr,
                (ulong)pmVar1->len);
      }
      for (arg._0_4_ = 0; (uint)arg < pmVar1->len >> 2; arg._0_4_ = (uint)arg + 1) {
        fprintf(_stdout," 0x%08x",(ulong)pmVar1[(long)(int)(uint)arg + 1].len);
      }
      for (arg._0_4_ = pmVar1->len & 0xfffffffc; (uint)arg < pmVar1->len; arg._0_4_ = (uint)arg + 1)
      {
        fprintf(_stdout," 0x%02x",(ulong)*(byte *)((long)&pmVar1[1].len + (long)(int)(uint)arg));
      }
      fprintf(_stdout,"\n");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  return;
}

Assistant:

void dump_args(struct mmt_memory_dump *args, int argc, uint64_t except_ptr)
{
	int i, j;

	for (i = 0; i < argc; ++i)
	{
		struct mmt_memory_dump *arg = &args[i];
		struct mmt_buf *data = arg->data;
		if (arg->addr == except_ptr)
			continue;
		mmt_log("        addr: 0x%016llx, size: %d, data:",
				(unsigned long long)arg->addr, data->len);
		for (j = 0; j < data->len / 4; ++j)
			mmt_log_cont(" 0x%08x", ((uint32_t *)data->data)[j]);
		for (j = data->len / 4 * 4; j < data->len; ++j)
			mmt_log_cont(" 0x%02x", data->data[j]);
		mmt_log_cont_nl();
	}
}